

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.h
# Opt level: O2

BLOCK_SIZE dim_to_size(int dim)

{
  if (dim == 0x80) {
    return BLOCK_128X128;
  }
  if (dim == 0x10) {
    return BLOCK_16X16;
  }
  if (dim == 0x20) {
    return BLOCK_32X32;
  }
  if (dim != 0x40) {
    if (dim == 8) {
      return BLOCK_8X8;
    }
    return BLOCK_4X4;
  }
  return BLOCK_64X64;
}

Assistant:

static BLOCK_SIZE dim_to_size(int dim) {
  switch (dim) {
    case 4: return BLOCK_4X4;
    case 8: return BLOCK_8X8;
    case 16: return BLOCK_16X16;
    case 32: return BLOCK_32X32;
    case 64: return BLOCK_64X64;
    case 128: return BLOCK_128X128;
    default: assert(0); return 0;
  }
}